

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt
strscan_hex(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex2,int32_t neg,uint32_t dig)

{
  byte bVar1;
  char cVar2;
  uint64_t local_60;
  uint local_58;
  uint local_54;
  uint local_48;
  uint32_t local_44;
  uint local_40;
  uint local_3c;
  uint32_t d;
  uint32_t i;
  uint64_t x;
  int32_t neg_local;
  int32_t ex2_local;
  uint32_t opt_local;
  StrScanFmt fmt_local;
  TValue *o_local;
  uint8_t *p_local;
  
  _d = 0;
  if (dig < 0x11) {
    local_44 = dig;
  }
  else {
    local_44 = 0x10;
  }
  o_local = (TValue *)p;
  for (local_3c = local_44; local_3c != 0; local_3c = local_3c - 1) {
    if (*(char *)o_local == '.') {
      bVar1 = *(byte *)((long)&(o_local->gcr).gcptr64 + 1);
      o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
    }
    else {
      bVar1 = *(byte *)o_local;
    }
    local_48 = (uint)bVar1;
    local_40 = local_48;
    if (0x39 < local_48) {
      local_40 = local_48 + 9;
    }
    _d = _d * 0x10 + (ulong)(local_40 & 0xf);
    o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
  }
  x._4_4_ = ex2;
  for (local_3c = 0x10; local_3c < dig; local_3c = local_3c + 1) {
    if (*(char *)o_local == '.') {
      cVar2 = *(char *)((long)&(o_local->gcr).gcptr64 + 1);
      o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
    }
    else {
      cVar2 = *(char *)o_local;
    }
    _d = (long)(int)(uint)(cVar2 != '0') | _d;
    x._4_4_ = x._4_4_ + 4;
    o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
  }
  local_58 = (uint)_d;
  if (fmt == STRSCAN_INT) {
    if ((((opt & 2) == 0) && (_d < neg + 0x80000000)) && ((_d != 0 || (neg == 0)))) {
      local_54 = local_58;
      if (neg != 0) {
        local_54 = (local_58 ^ 0xffffffff) + 1;
      }
      (o->field_4).i = local_54;
      return STRSCAN_INT;
    }
    if ((opt & 0x10) != 0) goto LAB_001482a8;
    ex2_local = 1;
  }
  else {
    if (fmt == STRSCAN_U32) {
LAB_001482a8:
      if (8 < dig) {
        return STRSCAN_ERROR;
      }
      if (neg != 0) {
        local_58 = (local_58 ^ 0xffffffff) + 1;
      }
      (o->field_4).i = local_58;
      return STRSCAN_U32;
    }
    ex2_local = fmt;
    if (fmt - STRSCAN_I64 < 2) {
      if (0x10 < dig) {
        return STRSCAN_ERROR;
      }
      if (neg == 0) {
        local_60 = _d;
      }
      else {
        local_60 = (_d ^ 0xffffffffffffffff) + 1;
      }
      o->u64 = local_60;
      return fmt;
    }
  }
  if ((_d & 0xc000000000000000) != 0) {
    _d = _d >> 2 | _d & 3;
    x._4_4_ = x._4_4_ + 2;
  }
  strscan_double(_d,o,x._4_4_,neg);
  return ex2_local;
}

Assistant:

static StrScanFmt strscan_hex(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex2, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;
  uint32_t i;

  /* Scan hex digits. */
  for (i = dig > 16 ? 16 : dig ; i; i--, p++) {
    uint32_t d = (*p != '.' ? *p : *++p); if (d > '9') d += 9;
    x = (x << 4) + (d & 15);
  }

  /* Summarize rounding-effect of excess digits. */
  for (i = 16; i < dig; i++, p++)
    x |= ((*p != '.' ? *p : *++p) != '0'), ex2 += 4;

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg &&
	!(x == 0 && neg)) {
      o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
      return STRSCAN_INT;  /* Fast path for 32 bit integers. */
    }
    if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; break; }
    /* fallthrough */
  case STRSCAN_U32:
    if (dig > 8) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
    return STRSCAN_U32;
  case STRSCAN_I64:
  case STRSCAN_U64:
    if (dig > 16) return STRSCAN_ERROR;
    o->u64 = neg ? ~x+1u : x;
    return fmt;
  default:
    break;
  }

  /* Reduce range, then convert to double. */
  if ((x & U64x(c0000000,0000000))) { x = (x >> 2) | (x & 3); ex2 += 2; }
  strscan_double(x, o, ex2, neg);
  return fmt;
}